

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O0

void anon_unknown.dwarf_23886::makeArg
               (int W,vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *ArgsTy,
               vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *RealArgsTy)

{
  undefined8 uVar1;
  GlobalVariable *pGVar2;
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *this;
  bool bVar3;
  int iVar4;
  GlobalVariable *pGVar5;
  value_type *__x;
  GlobalVariable *local_90;
  OptionalStorage<unsigned_int,_true> local_84 [2];
  Twine local_70;
  GlobalVariable *local_48;
  GlobalVariable *g;
  GlobalVariable *local_38;
  IntegerType *T;
  uint local_24;
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *pvStack_20;
  int RealW;
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *RealArgsTy_local;
  vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *ArgsTy_local;
  int W_local;
  
  local_24 = W;
  pvStack_20 = RealArgsTy;
  RealArgsTy_local = ArgsTy;
  ArgsTy_local._4_4_ = W;
  iVar4 = llvm::cl::opt_storage::operator_cast_to_int
                    ((opt_storage *)((anonymous_namespace)::Promote + 0x80));
  if ((iVar4 != -1) &&
     (iVar4 = llvm::cl::opt_storage::operator_cast_to_int
                        ((opt_storage *)((anonymous_namespace)::Promote + 0x80)),
     (int)ArgsTy_local._4_4_ < iVar4)) {
    local_24 = llvm::cl::opt_storage::operator_cast_to_int
                         ((opt_storage *)((anonymous_namespace)::Promote + 0x80));
  }
  this = RealArgsTy_local;
  T = (IntegerType *)
      llvm::Type::getIntNTy((LLVMContext *)&(anonymous_namespace)::C,ArgsTy_local._4_4_);
  std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::push_back(this,(value_type *)&T);
  g = (GlobalVariable *)llvm::Type::getIntNTy((LLVMContext *)&(anonymous_namespace)::C,local_24);
  __x = (value_type *)&g;
  local_38 = g;
  std::vector<llvm::Type_*,_std::allocator<llvm::Type_*>_>::push_back(pvStack_20,__x);
  bVar3 = llvm::cl::opt_storage::operator_cast_to_bool
                    ((opt_storage *)((anonymous_namespace)::ArgsFromMem + 0x80));
  if (bVar3) {
    pGVar5 = (GlobalVariable *)
             llvm::GlobalVariable::operator_new((GlobalVariable *)0x58,(size_t)__x);
    pGVar2 = local_38;
    uVar1 = (anonymous_namespace)::M;
    llvm::Twine::Twine(&local_70,"");
    llvm::Optional<unsigned_int>::Optional((Optional<unsigned_int> *)local_84,None);
    llvm::GlobalVariable::GlobalVariable(pGVar5,uVar1,pGVar2,0,0,0,&local_70,0,0,local_84[0],0);
    local_90 = pGVar5;
    local_48 = pGVar5;
    std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::push_back
              ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)(anonymous_namespace)::globs
               ,(value_type *)&local_90);
  }
  return;
}

Assistant:

void makeArg(int W, std::vector<Type *> &ArgsTy,
             std::vector<Type *> &RealArgsTy) {
  int RealW = W;
  if (Promote != -1 && Promote > W)
    RealW = Promote;
  ArgsTy.push_back(IntegerType::getIntNTy(C, W));
  auto T = IntegerType::getIntNTy(C, RealW);
  RealArgsTy.push_back(T);
  if (ArgsFromMem) {
    GlobalVariable *g =
        new GlobalVariable(*M, T, /*isConstant=*/false,
                           /*Linkage=*/GlobalValue::ExternalLinkage,
                           /*Initializer=*/0);
    globs.push_back(g);
  }
}